

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

result_type
boost::variant<spartsi::node,spartsi::ref_node>::
internal_apply_visitor_impl<boost::detail::variant::destroyer,void*>
          (int internal_which,int logical_which,destroyer *visitor,void *storage)

{
  void *storage_local;
  destroyer *visitor_local;
  int logical_which_local;
  int internal_which_local;
  
  detail::variant::
  visitation_impl<mpl_::int_<0>,boost::detail::variant::visitation_impl_step<boost::mpl::l_iter<boost::mpl::l_item<mpl_::long_<2l>,spartsi::node,boost::mpl::l_item<mpl_::long_<1l>,spartsi::ref_node,boost::mpl::l_end>>>,boost::mpl::l_iter<boost::mpl::l_end>>,boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
            (internal_which,logical_which,visitor,storage,0);
  return;
}

Assistant:

internal_apply_visitor_impl(
          int internal_which
        , int logical_which
        , Visitor& visitor
        , VoidPtrCV storage
        )
    {
        typedef mpl::int_<0> first_which;
        typedef typename mpl::begin<internal_types>::type first_it;
        typedef typename mpl::end<internal_types>::type last_it;

        typedef detail::variant::visitation_impl_step<
              first_it, last_it
            > first_step;

        return detail::variant::visitation_impl(
              internal_which, logical_which
            , visitor, storage, mpl::false_()
            , never_uses_backup_flag()
            , static_cast<first_which*>(0), static_cast<first_step*>(0)
            );
    }